

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void fe_mul_impl(fe_limb_t *out,fe_limb_t *in1,fe_limb_t *in2)

{
  int iVar1;
  uint local_2c;
  uint local_28;
  uint _assert_fe_i_2;
  uint _assert_fe_i_1;
  uint _assert_fe_i;
  fe_limb_t *in2_local;
  fe_limb_t *in1_local;
  fe_limb_t *out_local;
  
  _assert_fe_i_2 = 0;
  while( true ) {
    if (4 < _assert_fe_i_2) {
      local_28 = 0;
      while( true ) {
        if (4 < local_28) {
          fiat_25519_carry_mul(out,in1,in2);
          local_2c = 0;
          while( true ) {
            if (4 < local_2c) {
              return;
            }
            iVar1 = constant_time_declassify_int((uint)(out[local_2c] < 0x8cccccccccccd));
            if (iVar1 == 0) break;
            local_2c = local_2c + 1;
          }
          __assert_fail("constant_time_declassify_int(out[_assert_fe_i] <= 0x8ccccccccccccUL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                        ,0xd8,"void fe_mul_impl(fe_limb_t *, const fe_limb_t *, const fe_limb_t *)")
          ;
        }
        iVar1 = constant_time_declassify_int((uint)(in2[local_28] < 0x1a666666666665));
        if (iVar1 == 0) break;
        local_28 = local_28 + 1;
      }
      __assert_fail("constant_time_declassify_int(in2[_assert_fe_i] <= 0x1a666666666664UL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xd6,"void fe_mul_impl(fe_limb_t *, const fe_limb_t *, const fe_limb_t *)");
    }
    iVar1 = constant_time_declassify_int((uint)(in1[_assert_fe_i_2] < 0x1a666666666665));
    if (iVar1 == 0) break;
    _assert_fe_i_2 = _assert_fe_i_2 + 1;
  }
  __assert_fail("constant_time_declassify_int(in1[_assert_fe_i] <= 0x1a666666666664UL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                ,0xd5,"void fe_mul_impl(fe_limb_t *, const fe_limb_t *, const fe_limb_t *)");
}

Assistant:

static void fe_mul_impl(fe_limb_t out[FE_NUM_LIMBS],
                        const fe_limb_t in1[FE_NUM_LIMBS],
                        const fe_limb_t in2[FE_NUM_LIMBS]) {
  assert_fe_loose(in1);
  assert_fe_loose(in2);
  fiat_25519_carry_mul(out, in1, in2);
  assert_fe(out);
}